

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O0

Vec_Int_t * Llb_DriverCollectCs(Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vVars;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManRegNum(pAig);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_24 = 0; iVar1 = Saig_ManRegNum(pAig), local_24 < iVar1; local_24 = local_24 + 1) {
    p = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p,local_24 + iVar1);
    iVar1 = Aig_ObjId(pObj_00);
    Vec_IntPush(p_00,iVar1);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Llb_DriverCollectCs( Aig_Man_t * pAig )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntPush( vVars, Aig_ObjId(pObj) );
    return vVars;
}